

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffkshf(fitsfile *fptr,int colmin,int colmax,int incre,int *status)

{
  int *status_00;
  size_t sVar1;
  uint uVar2;
  int nrec;
  long lVar3;
  int tstatus;
  int nkeys;
  int *local_170;
  fitsfile *local_168;
  int local_15c;
  long ivalue;
  long local_150;
  long local_148;
  int nmore;
  char q [75];
  char rec [81];
  char newkey [75];
  
  local_170 = status;
  local_168 = fptr;
  ffghsp(fptr,&nkeys,&nmore,status);
  local_148 = (long)colmax;
  local_150 = (long)incre;
  nrec = 9;
  local_15c = incre;
  do {
    if (nkeys < nrec) {
      return *local_170;
    }
    ffgrec(local_168,nrec,rec,local_170);
    if (rec[0] == 'T') {
      strncpy(q,rec + 1,4);
      uVar2 = 5;
      if (((((((q._0_4_ != 0x45505954) && (q._0_4_ != 0x494e5543)) && (q._0_4_ != 0x4c414353)) &&
            ((q._0_4_ != 0x4c4c554e && (q._0_4_ != 0x4c4f4342)))) &&
           (((q._0_4_ != 0x4c565243 && ((q._0_4_ != 0x4d524f46 && (q._0_4_ != 0x4e494d44)))) &&
            (q._0_4_ != 0x4e494d4c)))) &&
          ((((q._0_4_ != 0x4f52455a && (q._0_4_ != 0x50534944)) && (q._0_4_ != 0x50595443)) &&
           (((q._0_4_ != 0x54494e55 && (q._0_4_ != 0x544c4443)) &&
            ((q._0_4_ != 0x544f5243 && ((q._0_4_ != 0x58414d44 && (q._0_4_ != 0x58414d4c))))))))))
         && (q._0_4_ != 0x58505243)) {
        uVar2 = 4;
        if (rec._0_4_ != 0x4d494454) goto LAB_00114784;
      }
      q._0_4_ = q._0_4_ & 0xffffff00;
      strncat(q,rec + uVar2,(ulong)(8 - uVar2));
      tstatus = 0;
      ffc2ii(q,&ivalue,&tstatus);
      if ((tstatus == 0) && (ivalue <= local_148 && colmin <= ivalue)) {
        if (ivalue == colmin && local_15c < 1) {
          ffdrec(local_168,nrec,local_170);
          nkeys = nkeys + -1;
          nrec = nrec + -1;
        }
        else {
          lVar3 = ivalue + local_150;
          q._0_4_ = q._0_4_ & 0xffffff00;
          ivalue = lVar3;
          strncat(q,rec,(ulong)uVar2);
          status_00 = local_170;
          ffkeyn(q,(int)lVar3,newkey,local_170);
          builtin_strncpy(rec,"        ",8);
          sVar1 = strlen(newkey);
          strncpy(rec,newkey,(long)(int)sVar1);
          ffmrec(local_168,nrec,rec,status_00);
        }
      }
    }
LAB_00114784:
    nrec = nrec + 1;
  } while( true );
}

Assistant:

int ffkshf(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colmin,      /* I - starting col. to be incremented; 1 = 1st */
           int colmax,      /* I - last column to be incremented            */
           int incre,       /* I - shift index number by this amount        */
           int *status)     /* IO - error status                            */
/*
  shift the index value on any existing column keywords
  This routine will modify the name of any keyword that begins with 'T'
  and has an index number in the range COLMIN - COLMAX, inclusive.

  if incre is positive, then the index values will be incremented.
  if incre is negative, then the kewords with index = COLMIN
  will be deleted and the index of higher numbered keywords will
  be decremented.
*/
{
    int nkeys, nmore, nrec, tstatus, i1;
    long ivalue;
    char rec[FLEN_CARD], q[FLEN_KEYWORD], newkey[FLEN_KEYWORD];

    ffghsp(fptr, &nkeys, &nmore, status);  /* get number of keywords */

    /* go thru header starting with the 9th keyword looking for 'TxxxxNNN' */

    for (nrec = 9; nrec <= nkeys; nrec++)
    {     
        ffgrec(fptr, nrec, rec, status);

        if (rec[0] == 'T')
        {
            i1 = 0;
            strncpy(q, &rec[1], 4);
            if (!strncmp(q, "BCOL", 4) || !strncmp(q, "FORM", 4) ||
                !strncmp(q, "TYPE", 4) || !strncmp(q, "SCAL", 4) ||
                !strncmp(q, "UNIT", 4) || !strncmp(q, "NULL", 4) ||
                !strncmp(q, "ZERO", 4) || !strncmp(q, "DISP", 4) ||
                !strncmp(q, "LMIN", 4) || !strncmp(q, "LMAX", 4) ||
                !strncmp(q, "DMIN", 4) || !strncmp(q, "DMAX", 4) ||
                !strncmp(q, "CTYP", 4) || !strncmp(q, "CRPX", 4) ||
                !strncmp(q, "CRVL", 4) || !strncmp(q, "CDLT", 4) ||
                !strncmp(q, "CROT", 4) || !strncmp(q, "CUNI", 4) )
              i1 = 5;
            else if (!strncmp(rec, "TDIM", 4) )
              i1 = 4;

            if (i1)
            {
              /* try reading the index number suffix */
              q[0] = '\0';
              strncat(q, &rec[i1], 8 - i1);

              tstatus = 0;
              ffc2ii(q, &ivalue, &tstatus);

              if (tstatus == 0 && ivalue >= colmin && ivalue <= colmax)
              {
                if (incre <= 0 && ivalue == colmin)       
                {
                  ffdrec(fptr, nrec, status); /* delete keyword */
                  nkeys = nkeys - 1;
                  nrec = nrec - 1;
                }
                else
                {
                  ivalue = ivalue + incre;
                  q[0] = '\0';
                  strncat(q, rec, i1);
     
                  ffkeyn(q, ivalue, newkey, status);
		  /* NOTE: because of null termination, it is not 
		     equivalent to use strcpy() for the same calls */
                  strncpy(rec, "        ", 8);    /* erase old keyword name */
                  i1 = strlen(newkey);
                  strncpy(rec, newkey, i1);   /* overwrite new keyword name */
                  ffmrec(fptr, nrec, rec, status);  /* modify the record */
                }
              }
            }
        }
    }
    return(*status);
}